

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

uint8 * resample_row_h_2(uint8 *out,uint8 *in_near,uint8 *in_far,int w,int hs)

{
  uint8 uVar1;
  int iVar2;
  int n;
  uint8 *input;
  int i;
  int hs_local;
  int w_local;
  uint8 *in_far_local;
  uint8 *in_near_local;
  uint8 *out_local;
  
  if (w == 1) {
    uVar1 = *in_near;
    out[1] = uVar1;
    *out = uVar1;
  }
  else {
    *out = *in_near;
    out[1] = (uint8)((int)((uint)*in_near * 3 + (uint)in_near[1] + 2) >> 2);
    for (input._4_4_ = 1; input._4_4_ < w + -1; input._4_4_ = input._4_4_ + 1) {
      iVar2 = (uint)in_near[input._4_4_] * 3 + 2;
      out[input._4_4_ << 1] = (uint8)((int)(iVar2 + (uint)in_near[input._4_4_ + -1]) >> 2);
      out[input._4_4_ * 2 + 1] = (uint8)((int)(iVar2 + (uint)in_near[input._4_4_ + 1]) >> 2);
    }
    out[input._4_4_ << 1] =
         (uint8)((int)((uint)in_near[w + -2] * 3 + (uint)in_near[w + -1] + 2) >> 2);
    out[input._4_4_ * 2 + 1] = in_near[w + -1];
  }
  return out;
}

Assistant:

static uint8*  resample_row_h_2(uint8 *out, uint8 *in_near, uint8 *in_far, int w, int hs)
{
   // need to generate two samples horizontally for every one in input
   int i;
   uint8 *input = in_near;
   if (w == 1) {
      // if only one sample, can't do any interpolation
      out[0] = out[1] = input[0];
      return out;
   }

   out[0] = input[0];
   out[1] = div4(input[0]*3 + input[1] + 2);
   for (i=1; i < w-1; ++i) {
      int n = 3*input[i]+2;
      out[i*2+0] = div4(n+input[i-1]);
      out[i*2+1] = div4(n+input[i+1]);
   }
   out[i*2+0] = div4(input[w-2]*3 + input[w-1] + 2);
   out[i*2+1] = input[w-1];
   return out;
}